

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O1

uint Extra_TruthCanonP(uint uTruth,int nVars)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  bool bVar5;
  
  if (Extra_TruthCanonP::pPerms == (char **)0x0) {
    if (nVars < 1) {
LAB_00488aef:
      Extra_TruthCanonP::nPerms = 1;
    }
    else {
      Extra_TruthCanonP::nPerms = 1;
      iVar2 = 1;
      do {
        Extra_TruthCanonP::nPerms = Extra_TruthCanonP::nPerms * iVar2;
        bVar5 = iVar2 != nVars;
        iVar2 = iVar2 + 1;
      } while (bVar5);
    }
  }
  else {
    if (Extra_TruthCanonP::nVarsOld == nVars) goto LAB_00488b0e;
    free(Extra_TruthCanonP::pPerms);
    Extra_TruthCanonP::pPerms = (char **)0x0;
    if (nVars < 1) goto LAB_00488aef;
    Extra_TruthCanonP::nPerms = 1;
    iVar2 = 1;
    do {
      Extra_TruthCanonP::nPerms = Extra_TruthCanonP::nPerms * iVar2;
      bVar5 = iVar2 != nVars;
      iVar2 = iVar2 + 1;
    } while (bVar5);
  }
  Extra_TruthCanonP::pPerms = Extra_Permutations(nVars);
  Extra_TruthCanonP::nVarsOld = nVars;
LAB_00488b0e:
  if (Extra_TruthCanonP::nPerms < 1) {
    uVar3 = 0xffffffff;
  }
  else {
    uVar3 = 0xffffffff;
    lVar4 = 0;
    do {
      uVar1 = Extra_TruthPermute(uTruth,Extra_TruthCanonP::pPerms[lVar4],nVars,0);
      if (uVar1 <= uVar3) {
        uVar3 = uVar1;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < Extra_TruthCanonP::nPerms);
  }
  return uVar3;
}

Assistant:

unsigned Extra_TruthCanonP( unsigned uTruth, int nVars )
{
    static int nVarsOld, nPerms;
    static char ** pPerms = NULL;

    unsigned uTruthMin, uPerm;
    int k;

    if ( pPerms == NULL )
    {
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }
    else if ( nVarsOld != nVars )
    {
        ABC_FREE( pPerms );
        nPerms = Extra_Factorial( nVars );   
        pPerms = Extra_Permutations( nVars );
        nVarsOld = nVars;
    }

    uTruthMin = 0xFFFFFFFF;
    for ( k = 0; k < nPerms; k++ )
    {
        uPerm = Extra_TruthPermute( uTruth, pPerms[k], nVars, 0 );
        if ( uTruthMin > uPerm )
            uTruthMin = uPerm;
    }
    return uTruthMin;
}